

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O2

void __thiscall CVmObjByteArray::notify_delete(CVmObjByteArray *this,int param_1)

{
  uint uVar1;
  long lVar2;
  uint *puVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  bool bVar7;
  
  puVar3 = (uint *)(this->super_CVmObject).ext_;
  if (puVar3 != (uint *)0x0) {
    uVar1 = *puVar3;
    if (uVar1 != 0) {
      puVar3 = puVar3 + 1;
      uVar4 = (ulong)uVar1;
      for (lVar5 = 0; lVar5 != (ulong)(uVar1 >> 0x1c) + 1; lVar5 = lVar5 + 1) {
        lVar2 = *(long *)puVar3;
        uVar6 = 0;
        while ((uVar6 < 0x2000 && (uVar4 != 0))) {
          free(*(void **)(lVar2 + uVar6 * 8));
          bVar7 = uVar4 < 0x8000;
          uVar4 = uVar4 - 0x8000;
          if (bVar7) {
            uVar4 = 0;
          }
          uVar6 = uVar6 + 1;
        }
        free(*(void **)puVar3);
        puVar3 = puVar3 + 2;
      }
      puVar3 = (uint *)(this->super_CVmObject).ext_;
    }
    (*G_mem_X->varheap_->_vptr_CVmVarHeap[6])(G_mem_X->varheap_,puVar3);
    return;
  }
  return;
}

Assistant:

void CVmObjByteArray::notify_delete(VMG_ int /*in_root_set*/)
{
    size_t slot;
    unsigned char ***slotp;
    size_t slot_cnt;
    size_t bytes_rem;

    /* if we have no extension, there's nothing to do */
    if (ext_ == 0)
        return;

    /* calculate the number of second-level page table slots */
    slot_cnt = (size_t)(get_element_count() == 0
                        ? 0
                        : ((get_element_count() >> 28) + 1));

    /* we have all of the bytes in the array left do delete */
    bytes_rem = get_element_count();

    /* traverse the list of second-level page tables and delete each one */
    for (slot = 0, slotp = get_page_table_array() ; slot < slot_cnt ;
         ++slot, ++slotp)
    {
        size_t pg;
        unsigned char **pgp;
        
        /* traverse each page in this page table */
        for (pg = 0, pgp = *slotp ; pg < 8*1024 && bytes_rem != 0 ;
             ++pg, ++pgp)
        {
            /* delete this page */
            t3free(*pgp);

            /* 
             *   deduct this page's size from the remaining bytes to delete
             *   - the page size is up to 32k, but no more than the
             *   remaining size
             */
            if (bytes_rem > 32*1024)
                bytes_rem -= 32*1024;
            else
                bytes_rem = 0;
        }

        /* delete this page table */
        t3free(*slotp);
    }

    /* free our extension */
    G_mem->get_var_heap()->free_mem(ext_);
}